

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PoolingLayerParams::SerializeWithCachedSizes
          (PoolingLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  PoolingLayerParams_PoolingType PVar2;
  int iVar3;
  uint64 uVar4;
  int local_28;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  PoolingLayerParams *this_local;
  
  PVar2 = type(this);
  if (PVar2 != PoolingLayerParams_PoolingType_MAX) {
    PVar2 = type(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(1,PVar2,output);
  }
  iVar3 = kernelsize_size(this);
  if (0 < iVar3) {
    google::protobuf::internal::WireFormatLite::WriteTag(10,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_kernelsize_cached_byte_size_);
  }
  i_1 = 0;
  iVar3 = kernelsize_size(this);
  for (; i_1 < iVar3; i_1 = i_1 + 1) {
    uVar4 = kernelsize(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(uVar4,output);
  }
  iVar3 = stride_size(this);
  if (0 < iVar3) {
    google::protobuf::internal::WireFormatLite::WriteTag(0x14,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_stride_cached_byte_size_);
  }
  local_28 = 0;
  iVar3 = stride_size(this);
  for (; local_28 < iVar3; local_28 = local_28 + 1) {
    uVar4 = stride(this,local_28);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(uVar4,output);
  }
  bVar1 = has_valid(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1e,&((this->PoolingPaddingType_).valid_)->super_MessageLite,output);
  }
  bVar1 = has_same(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1f,&((this->PoolingPaddingType_).valid_)->super_MessageLite,output);
  }
  bVar1 = has_includelastpixel(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x20,&((this->PoolingPaddingType_).valid_)->super_MessageLite,output);
  }
  bVar1 = avgpoolexcludepadding(this);
  if (bVar1) {
    bVar1 = avgpoolexcludepadding(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x32,bVar1,output);
  }
  bVar1 = globalpooling(this);
  if (bVar1) {
    bVar1 = globalpooling(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x3c,bVar1,output);
  }
  return;
}

Assistant:

void PoolingLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.PoolingLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.PoolingLayerParams.PoolingType type = 1;
  if (this->type() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->type(), output);
  }

  // repeated uint64 kernelSize = 10;
  if (this->kernelsize_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(10, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_kernelsize_cached_byte_size_);
  }
  for (int i = 0, n = this->kernelsize_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->kernelsize(i), output);
  }

  // repeated uint64 stride = 20;
  if (this->stride_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(20, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_stride_cached_byte_size_);
  }
  for (int i = 0, n = this->stride_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->stride(i), output);
  }

  // .CoreML.Specification.ValidPadding valid = 30;
  if (has_valid()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      30, *PoolingPaddingType_.valid_, output);
  }

  // .CoreML.Specification.SamePadding same = 31;
  if (has_same()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      31, *PoolingPaddingType_.same_, output);
  }

  // .CoreML.Specification.PoolingLayerParams.ValidCompletePadding includeLastPixel = 32;
  if (has_includelastpixel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      32, *PoolingPaddingType_.includelastpixel_, output);
  }

  // bool avgPoolExcludePadding = 50;
  if (this->avgpoolexcludepadding() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(50, this->avgpoolexcludepadding(), output);
  }

  // bool globalPooling = 60;
  if (this->globalpooling() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(60, this->globalpooling(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.PoolingLayerParams)
}